

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

InteractResult * __thiscall
net_tests::anon_unknown_17::V2TransportTester::Interact
          (InteractResult *__return_storage_ptr__,V2TransportTester *this)

{
  V2Transport *this_00;
  pointer pbVar1;
  pointer pbVar2;
  const_iterator __first;
  bool bVar3;
  bool bVar4;
  unsigned_long uVar5;
  long lVar6;
  _Elt_pointer msg;
  long in_FS_OFFSET;
  bool reject;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> ret;
  Span<const_unsigned_char> to_send;
  bool local_a9;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> local_a8;
  CNetMessage local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->m_transport;
LAB_00402e9b:
  do {
    pbVar1 = (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 == pbVar2) {
LAB_00402ee3:
      bVar3 = false;
    }
    else {
      uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (&this->m_rng->super_RandomMixin<FastRandomContext>,
                         (long)pbVar2 - (long)pbVar1);
      local_88.m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_start = pbVar1;
      local_88.m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar5 + 1);
      bVar3 = V2Transport::ReceivedBytes(this_00,(Span<const_unsigned_char> *)&local_88);
      if (!bVar3) {
        (__return_storage_ptr__->
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged = false;
        goto LAB_00403053;
      }
      lVar6 = (long)(uVar5 + 1) -
              (long)local_88.m_recv.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      if (lVar6 == 0) goto LAB_00402ee3;
      __first._M_current =
           (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      bVar3 = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&this->m_to_send,__first,(const_iterator)(__first._M_current + lVar6));
    }
    bVar4 = V2Transport::ReceivedMessageComplete(this_00);
    if ((bVar4) &&
       ((!bVar3 ||
        (bVar4 = RandomMixin<FastRandomContext>::randbool
                           (&this->m_rng->super_RandomMixin<FastRandomContext>), bVar4)))) {
      local_a9 = false;
      V2Transport::GetReceivedMessage(&local_88,this_00,(microseconds)0x0,&local_a9);
      if (local_a9 == true) {
        std::vector<std::optional<CNetMessage>,std::allocator<std::optional<CNetMessage>>>::
        emplace_back<std::nullopt_t_const&>
                  ((vector<std::optional<CNetMessage>,std::allocator<std::optional<CNetMessage>>> *)
                   &local_a8,(nullopt_t *)&std::nullopt);
      }
      else {
        std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
        emplace_back<CNetMessage>(&local_a8,&local_88);
      }
      CNetMessage::~CNetMessage(&local_88);
      bVar3 = true;
    }
    msg = (this->m_msg_to_send).
          super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    if ((this->m_msg_to_send).
        super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != msg) {
      if (bVar3) {
        bVar4 = RandomMixin<FastRandomContext>::randbool
                          (&this->m_rng->super_RandomMixin<FastRandomContext>);
        if (!bVar4) goto LAB_00402f9e;
        msg = (this->m_msg_to_send).
              super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
      }
      bVar4 = V2Transport::SetMessageToSend(this_00,msg);
      if (bVar4) {
        std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::pop_front
                  (&this->m_msg_to_send);
        bVar3 = true;
      }
    }
LAB_00402f9e:
    V2Transport::GetBytesToSend_abi_cxx11_
              ((BytesToSend *)&local_88,this_00,
               (this->m_msg_to_send).
               super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               (this->m_msg_to_send).
               super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur);
    if (local_88.m_recv.m_read_pos != 0) {
      if ((!bVar3) ||
         (bVar3 = RandomMixin<FastRandomContext>::randbool
                            (&this->m_rng->super_RandomMixin<FastRandomContext>), bVar3)) {
        uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&this->m_rng->super_RandomMixin<FastRandomContext>,
                           local_88.m_recv.m_read_pos);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_received,
                   (const_iterator)
                   (this->m_received).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_88.m_recv.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   local_88.m_recv.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + uVar5 + 1);
        V2Transport::MarkBytesSent(this_00,uVar5 + 1);
      }
      goto LAB_00402e9b;
    }
    if (!bVar3) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl = local_a8.
                   super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
               ._M_impl + 8) =
           local_a8.
           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
               ._M_impl + 0x10) =
           local_a8.
           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.
      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged = true;
LAB_00403053:
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                (&local_a8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

InteractResult Interact()
    {
        std::vector<std::optional<CNetMessage>> ret;
        while (true) {
            bool progress{false};
            // Send bytes from m_to_send to the transport.
            if (!m_to_send.empty()) {
                Span<const uint8_t> to_send = Span{m_to_send}.first(1 + m_rng.randrange(m_to_send.size()));
                size_t old_len = to_send.size();
                if (!m_transport.ReceivedBytes(to_send)) {
                    return std::nullopt; // transport error occurred
                }
                if (old_len != to_send.size()) {
                    progress = true;
                    m_to_send.erase(m_to_send.begin(), m_to_send.begin() + (old_len - to_send.size()));
                }
            }
            // Retrieve messages received by the transport.
            if (m_transport.ReceivedMessageComplete() && (!progress || m_rng.randbool())) {
                bool reject{false};
                auto msg = m_transport.GetReceivedMessage({}, reject);
                if (reject) {
                    ret.emplace_back(std::nullopt);
                } else {
                    ret.emplace_back(std::move(msg));
                }
                progress = true;
            }
            // Enqueue a message to be sent by the transport to us.
            if (!m_msg_to_send.empty() && (!progress || m_rng.randbool())) {
                if (m_transport.SetMessageToSend(m_msg_to_send.front())) {
                    m_msg_to_send.pop_front();
                    progress = true;
                }
            }
            // Receive bytes from the transport.
            const auto& [recv_bytes, _more, _msg_type] = m_transport.GetBytesToSend(!m_msg_to_send.empty());
            if (!recv_bytes.empty() && (!progress || m_rng.randbool())) {
                size_t to_receive = 1 + m_rng.randrange(recv_bytes.size());
                m_received.insert(m_received.end(), recv_bytes.begin(), recv_bytes.begin() + to_receive);
                progress = true;
                m_transport.MarkBytesSent(to_receive);
            }
            if (!progress) break;
        }
        return ret;
    }